

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::utp_stream::
async_write_some<boost::asio::const_buffers_1,boost::asio::detail::write_op<libtorrent::aux::socket_type,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
          (utp_stream *this,const_buffers_1 *buffers,
          write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
          *handler)

{
  io_context *piVar1;
  write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  *__f;
  bool bVar2;
  size_t sVar3;
  void *buf;
  unsigned_long local_190;
  error_code local_188;
  type local_178;
  const_buffer *local_118;
  const_buffer *end;
  const_buffer *i;
  size_t bytes_added;
  basic_errors local_f4;
  type local_f0;
  unsigned_long local_88;
  basic_errors local_7c;
  type local_78;
  write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  *local_20;
  write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  *handler_local;
  const_buffers_1 *buffers_local;
  utp_stream *this_local;
  
  local_20 = handler;
  handler_local =
       (write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
        *)buffers;
  buffers_local = (const_buffers_1 *)this;
  if (this->m_impl == (utp_socket_impl *)0x0) {
    piVar1 = this->m_io_service;
    local_7c = not_connected;
    local_88 = 0;
    std::
    bind<void,boost::asio::detail::write_op<libtorrent::aux::socket_type,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>const&,boost::asio::error::basic_errors,unsigned_long>
              (&local_78,handler,&local_7c,&local_88);
    boost::asio::io_context::
    post<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::socket_type,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::asio::error::basic_errors,unsigned_long)>>
              (piVar1,&local_78);
    std::
    _Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>_(boost::asio::error::basic_errors,_unsigned_long)>
    ::~_Bind_result(&local_78);
  }
  else {
    bVar2 = std::function::operator_cast_to_bool((function *)&this->m_write_handler);
    if (bVar2) {
      piVar1 = this->m_io_service;
      local_f4 = operation_not_supported;
      bytes_added = 0;
      std::
      bind<void,boost::asio::detail::write_op<libtorrent::aux::socket_type,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>const&,boost::asio::error::basic_errors,unsigned_long>
                (&local_f0,local_20,&local_f4,&bytes_added);
      boost::asio::io_context::
      post<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::socket_type,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::asio::error::basic_errors,unsigned_long)>>
                (piVar1,&local_f0);
      std::
      _Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>_(boost::asio::error::basic_errors,_unsigned_long)>
      ::~_Bind_result(&local_f0);
    }
    else {
      i = (const_buffer *)0x0;
      end = boost::asio::buffer_sequence_begin<boost::asio::const_buffers_1>
                      ((const_buffers_1 *)handler_local,(type *)0x0);
      local_118 = boost::asio::buffer_sequence_end<boost::asio::const_buffers_1>
                            ((const_buffers_1 *)handler_local,(type *)0x0);
      for (; __f = local_20, end != local_118; end = end + 1) {
        sVar3 = boost::asio::buffer_size<boost::asio::const_buffer>(end);
        if (sVar3 != 0) {
          buf = boost::asio::buffer_cast<void_const*>(end);
          sVar3 = boost::asio::buffer_size<boost::asio::const_buffer>(end);
          add_write_buffer(this,buf,sVar3);
          sVar3 = boost::asio::buffer_size<boost::asio::const_buffer>(end);
          i = (const_buffer *)((long)&i->data_ + sVar3);
        }
      }
      if (i == (const_buffer *)0x0) {
        piVar1 = this->m_io_service;
        boost::system::error_code::error_code(&local_188);
        local_190 = 0;
        std::
        bind<void,boost::asio::detail::write_op<libtorrent::aux::socket_type,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>const&,boost::system::error_code,unsigned_long>
                  (&local_178,__f,&local_188,&local_190);
        boost::asio::io_context::
        post<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::socket_type,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code,unsigned_long)>>
                  (piVar1,&local_178);
        std::
        _Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>_(boost::system::error_code,_unsigned_long)>
        ::~_Bind_result(&local_178);
      }
      else {
        std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                  ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                   &this->m_write_handler,local_20);
        issue_write(this);
      }
    }
  }
  return;
}

Assistant:

void async_write_some(Const_Buffers const& buffers, Handler const& handler)
	{
		if (m_impl == nullptr)
		{
			m_io_service.post(std::bind<void>(handler
				, boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_write_handler);
		if (m_write_handler)
		{
			m_io_service.post(std::bind<void>(handler
				, boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}

		std::size_t bytes_added = 0;
#if BOOST_VERSION >= 106600
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
#else
		for (typename Const_Buffers::const_iterator i = buffers.begin()
			, end(buffers.end()); i != end; ++i)
#endif
		{
			if (buffer_size(*i) == 0) continue;
			using boost::asio::buffer_cast;
			using boost::asio::buffer_size;
			add_write_buffer(buffer_cast<void const*>(*i), buffer_size(*i));
			bytes_added += buffer_size(*i);
		}
		if (bytes_added == 0)
		{
			// if we're writing 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			m_io_service.post(std::bind<void>(handler, error_code(), std::size_t(0)));
			return;
		}
		m_write_handler = handler;
		issue_write();
	}